

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

bool P_LerpCalculate(AActor *pmo,PredictPos *from,PredictPos *to,PredictPos *result,float scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  DVector3 local_48;
  DVector3 local_28;
  
  dVar1 = (from->pos).Z;
  dVar3 = (to->pos).Z;
  dVar4 = (double)scale;
  dVar3 = ((dVar3 - dVar1) * dVar4 + dVar1) - dVar3;
  dVar1 = (from->pos).X;
  dVar2 = (from->pos).Y;
  dVar5 = (to->pos).X;
  dVar6 = (to->pos).Y;
  dVar5 = (dVar4 * (dVar5 - dVar1) + dVar1) - dVar5;
  dVar6 = (dVar4 * (dVar6 - dVar2) + dVar2) - dVar6;
  local_48.X = dVar5;
  local_48.Y = dVar6;
  local_48.Z = dVar3;
  AActor::Vec3Offset(&local_28,pmo,&local_48,false);
  (result->pos).Z = local_28.Z;
  (result->pos).X = local_28.X;
  (result->pos).Y = local_28.Y;
  return scale <= 1.0 &&
         (double)cl_predict_lerpthreshold.Value < dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5;
}

Assistant:

bool P_LerpCalculate(AActor *pmo, PredictPos from, PredictPos to, PredictPos &result, float scale)
{
	//DVector2 pfrom = Displacements.getOffset(from.portalgroup, to.portalgroup);
	DVector3 vecFrom = from.pos;
	DVector3 vecTo = to.pos;
	DVector3 vecResult;
	vecResult = vecTo - vecFrom;
	vecResult *= scale;
	vecResult = vecResult + vecFrom;
	DVector3 delta = vecResult - vecTo;

	result.pos = pmo->Vec3Offset(vecResult - to.pos);
	//result.portalgroup = P_PointInSector(result.pos.x, result.pos.y)->PortalGroup;

	// As a fail safe, assume extrapolation is the threshold.
	return (delta.LengthSquared() > cl_predict_lerpthreshold && scale <= 1.00f);
}